

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Msg.cpp
# Opt level: O2

Msg * __thiscall util::logging::Msg::operator+(Msg *__return_storage_ptr__,Msg *this,string *val)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  std::__cxx11::string::string((string *)&local_68,(string *)&this->msg_txt);
  std::operator+(&local_48,&local_68,val);
  Msg(__return_storage_ptr__,&local_48,this->msg_lvl);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  return __return_storage_ptr__;
}

Assistant:

Msg Msg::operator+( const std::string & val)
		{
			return Msg(getMsg_txt() + val, getMsg_lvl());
		}